

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::persistence_computer_t
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,directed_flag_complex_in_memory_computer_t *_complex,
          output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
          *_output,size_t _max_entries,int _modulus,value_t _max_filtration)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined2 in_R8W;
  undefined4 in_XMM0_Da;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = in_XMM0_Da;
  in_RDI[3] = in_RCX;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined1 *)((long)in_RDI + 0x24) = 1;
  *(undefined2 *)((long)in_RDI + 0x26) = in_R8W;
  multiplicative_inverse_vector((coefficient_t)((ulong)in_RDI >> 0x30));
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::deque
            ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)0x1b52a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b52bb);
  std::
  vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ::vector((vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
            *)0x1b52cc);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b52dd);
  return;
}

Assistant:

persistence_computer_t(Complex& _complex, output_t<Complex>* _output,
	                       size_t _max_entries = std::numeric_limits<size_t>::max(), int _modulus = 2,
	                       value_t _max_filtration = std::numeric_limits<value_t>::max())
	    : complex(_complex), output(_output), max_filtration(_max_filtration), max_entries(_max_entries),
#ifdef USE_COEFFICIENTS
	      modulus(_modulus),
#endif
	      multiplicative_inverse(multiplicative_inverse_vector(modulus)) {
#ifndef USE_COEFFICIENTS
		if (_modulus != 2) {
			throw std::logic_error("If you want to use modulus != 2, please compile with coefficients.");
		}
#endif
	}